

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QObject * __thiscall QFactoryLoader::instance(QFactoryLoader *this,int index)

{
  long lVar1;
  QObject *pQVar2;
  QThread *pQVar3;
  int in_ESI;
  Private *in_RDI;
  long in_FS_OFFSET;
  QObject *obj;
  QMutexLocker<QMutex> lock;
  QMutex *in_stack_ffffffffffffff78;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff80;
  QObject *local_20;
  int index_00;
  QFactoryLoader *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    local_20 = (QObject *)0x0;
  }
  else {
    index_00 = -0x55555556;
    this_00 = (QFactoryLoader *)&DAT_aaaaaaaaaaaaaaaa;
    Private::operator->(in_RDI);
    QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_20 = instanceHelper_locked(this_00,index_00);
    if (local_20 != (QObject *)0x0) {
      pQVar2 = QObject::parent((QObject *)0x4452ec);
      if (pQVar2 == (QObject *)0x0) {
        pQVar3 = QCoreApplicationPrivate::mainThread();
        QObject::moveToThread(local_20,pQVar3);
      }
    }
    QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QObject *QFactoryLoader::instance(int index) const
{
    if (index < 0)
        return nullptr;

    QMutexLocker lock(&d->mutex);
    QObject *obj = instanceHelper_locked(index);

    if (obj && !obj->parent())
        obj->moveToThread(QCoreApplicationPrivate::mainThread());
    return obj;
}